

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void __thiscall Highs::deleteRowsInterface(Highs *this,HighsIndexCollection *index_collection)

{
  undefined3 uVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  HighsIndexCollection *in_RDI;
  HighsInt row;
  HighsInt new_row;
  HighsInt original_num_row;
  HighsBasis *basis;
  HighsLp *lp;
  HighsIndexCollection *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer *this_00;
  HighsIndexCollection *index_collection_00;
  
  index_collection_00 =
       (HighsIndexCollection *)
       &in_RDI[3].mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  this_00 = &in_RDI[1].set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  HighsLp::ensureColwise((HighsLp *)0x4da88a);
  iVar6 = *(int *)&index_collection_00->is_interval_;
  HighsLp::deleteRows((HighsLp *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_RDI);
  if (*(int *)&index_collection_00->is_interval_ != iVar6) {
    *(undefined4 *)
     ((long)&in_RDI[0x3a].set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    if (((ulong)in_RDI[1].set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish & 0x10000) != 0) {
      deleteBasisRows((HighsBasis *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8,0);
    }
    if (((ulong)index_collection_00[6].set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage & 0x100000000) != 0) {
      deleteScale(in_RSI,index_collection_00);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)this_00,
                 CONCAT44(iVar6,in_stack_ffffffffffffffd8));
      uVar1 = *(undefined3 *)&index_collection_00->field_0x5;
      index_collection_00[6].field_0x34 = index_collection_00->is_interval_;
      *(undefined3 *)&index_collection_00[6].field_0x35 = uVar1;
    }
    invalidateModelStatusSolutionAndInfo
              ((Highs *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    HEkk::deleteRows((HEkk *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
    if (((ulong)in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start & 1) != 0) {
      iVar4 = 0;
      for (iVar3 = 0; iVar3 < iVar6; iVar3 = iVar3 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(long)iVar3);
        if (*pvVar2 == 0) {
          iVar5 = iVar4;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,(long)iVar3);
          *pvVar2 = iVar4;
          iVar4 = iVar5 + 1;
        }
        else {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &in_RSI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,(long)iVar3);
          *pvVar2 = -1;
        }
      }
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)0x4daa0b);
  }
  return;
}

Assistant:

void Highs::deleteRowsInterface(HighsIndexCollection& index_collection) {
  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  lp.ensureColwise();
  // Keep a copy of the original number of rows to check whether
  // any rows have been removed, and if there is mask to be updated
  HighsInt original_num_row = lp.num_row_;

  lp.deleteRows(index_collection);
  // Bail out if no rows were actually deleted
  if (lp.num_row_ == original_num_row) return;

  assert(lp.num_row_ < original_num_row);

  // Nontrivial deletion so reset the model_status and update any
  // Highs basis
  model_status_ = HighsModelStatus::kNotset;
  if (basis_.useful) {
    assert(basis_.row_status.size() == static_cast<size_t>(original_num_row));
    // Have a full set of row basis status values, so maintain them,
    // and only invalidate the basis if a nonbasic row has been
    // deleted
    deleteBasisRows(basis_, index_collection, original_num_row);
  } else {
    assert(!basis.valid);
  }

  if (lp.scale_.has_scaling) {
    deleteScale(lp.scale_.row, index_collection);
    lp.scale_.row.resize(lp.num_row_);
    lp.scale_.num_row = lp.num_row_;
  }
  // Deduce the consequences of deleting rows
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.deleteRows(index_collection);
  if (index_collection.is_mask_) {
    HighsInt new_row = 0;
    for (HighsInt row = 0; row < original_num_row; row++) {
      if (!index_collection.mask_[row]) {
        index_collection.mask_[row] = new_row;
        new_row++;
      } else {
        index_collection.mask_[row] = -1;
      }
    }
    assert(new_row == lp.num_row_);
  }
  assert(lpDimensionsOk("deleteRows", lp, options_.log_options));
  lp.row_hash_.name2index.clear();
}